

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O2

void __thiscall POSGDiscrete::~POSGDiscrete(POSGDiscrete *this,void **vtt)

{
  void *pvVar1;
  pointer ppRVar2;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess =
       pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 + *(long *)((long)pvVar1 + -0x50)) = vtt[9];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[10];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0xb];
  *(void **)(&(this->super_MultiAgentDecisionProcessDiscrete).super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                super_MultiAgentDecisionProcess + -0x58)) = vtt[0xc];
  *(void **)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200 = vtt[0xd];
  for (ppRVar2 = (this->_m_p_rModel).
                 super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar2 !=
      (this->_m_p_rModel).
      super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppRVar2 = ppRVar2 + 1) {
    if (*ppRVar2 != (RewardModelMapping *)0x0) {
      (*((*ppRVar2)->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
        _vptr_QTableInterface[3])();
    }
  }
  std::_Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::~_Vector_base
            (&(this->_m_p_rModel).
              super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>);
  POSG::~POSG((POSG *)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200,vtt + 6);
  MultiAgentDecisionProcessDiscrete::~MultiAgentDecisionProcessDiscrete
            (&this->super_MultiAgentDecisionProcessDiscrete,vtt + 1);
  return;
}

Assistant:

POSGDiscrete::~POSGDiscrete()
{
    if(DEBUG_DPOMDPD)
        cout << "deleting POSGDiscrete (deleting rewards)"<<endl;
    for(vector<RewardModelMapping*>::iterator it = _m_p_rModel.begin();
            it != _m_p_rModel.end(); it++)
        delete *it;
}